

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded.cpp
# Opt level: O2

void __thiscall clickhouse::CodedOutputStream::WriteVarint64(CodedOutputStream *this,uint64_t value)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  uint8_t bytes [10];
  
  lVar2 = 0;
  do {
    lVar3 = 10;
    if (lVar2 == 10) break;
    lVar3 = lVar2 + 1;
    bytes[lVar2] = (0x7f < value) << 7 | (byte)value & 0x7f;
    bVar1 = 0x7f < value;
    lVar2 = lVar3;
    value = value >> 7;
  } while (bVar1);
  (*(this->output_->super_OutputStream)._vptr_OutputStream[3])(this->output_,bytes,(long)(int)lVar3)
  ;
  return;
}

Assistant:

void CodedOutputStream::WriteVarint64(uint64_t value) {
    uint8_t bytes[MAX_VARINT_BYTES];
    int size = 0;

    for (size_t i = 0; i < MAX_VARINT_BYTES; ++i) {
        uint8_t byte = value & 0x7F;
        if (value > 0x7F)
            byte |= 0x80;

        bytes[size++] = byte;

        value >>= 7;
        if (!value) {
            break;
        }
    }

    WriteRaw(bytes, size);
}